

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void av1_fwd_txfm2d_64x64_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long in_RSI;
  int col_1;
  int col;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [4096];
  undefined4 local_4070;
  undefined4 local_406c;
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffbf98;
  TX_SIZE in_stack_ffffffffffffbfa6;
  TX_TYPE in_stack_ffffffffffffbfa7;
  int in_stack_ffffffffffffc0dc;
  int32_t *in_stack_ffffffffffffc0e0;
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffc0e8;
  int in_stack_ffffffffffffc0f4;
  int32_t *in_stack_ffffffffffffc0f8;
  int16_t *in_stack_ffffffffffffc100;
  
  av1_get_fwd_txfm_cfg
            (in_stack_ffffffffffffbfa7,in_stack_ffffffffffffbfa6,in_stack_ffffffffffffbf98);
  fwd_txfm2d_c(in_stack_ffffffffffffc100,in_stack_ffffffffffffc0f8,in_stack_ffffffffffffc0f4,
               in_stack_ffffffffffffc0e8,in_stack_ffffffffffffc0e0,in_stack_ffffffffffffc0dc);
  for (local_406c = 0; local_406c < 0x20; local_406c = local_406c + 1) {
    memset((void *)(in_RSI + (long)(local_406c << 6) * 4 + 0x80),0,0x80);
  }
  memset((void *)(in_RSI + 0x2000),0,0x2000);
  for (local_4070 = 1; local_4070 < 0x20; local_4070 = local_4070 + 1) {
    memcpy((void *)(in_RSI + (long)(local_4070 << 5) * 4),
           (void *)(in_RSI + (long)(local_4070 << 6) * 4),0x80);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  int32_t txfm_buf[64 * 64];
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X64, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);

  // Zero out top-right 32x32 area.
  for (int col = 0; col < 32; ++col) {
    memset(output + col * 64 + 32, 0, 32 * sizeof(*output));
  }
  // Zero out the bottom 64x32 area.
  memset(output + 32 * 64, 0, 32 * 64 * sizeof(*output));
  // Re-pack non-zero coeffs in the first 32x32 indices.
  for (int col = 1; col < 32; ++col) {
    memcpy(output + col * 32, output + col * 64, 32 * sizeof(*output));
  }
}